

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O2

char * lower(char *buf,char *s)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char *p;
  
  for (lVar2 = 0; cVar1 = s[lVar2], cVar1 != '\0'; lVar2 = lVar2 + 1) {
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    buf[lVar2] = cVar3;
  }
  buf[lVar2] = '\0';
  return buf;
}

Assistant:

static const char *lower(char *buf, const char *s)
{
  char *p = buf;
  while (*s) {
    *p++ = (*s >= 'A' && *s <= 'Z') ? *s+0x20 : *s;
    s++;
  }
  *p = '\0';
  return buf;
}